

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_add_16_er_i(void)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint res;
  uint dst;
  uint src;
  uint *r_dst;
  
  puVar3 = m68ki_cpu.dar + (m68ki_cpu.ir >> 9 & 7);
  uVar1 = m68ki_read_imm_16();
  uVar2 = uVar1 + (*puVar3 & 0xffff);
  m68ki_cpu.n_flag = uVar2 >> 8;
  m68ki_cpu.v_flag = ((uVar1 ^ uVar2) & (*puVar3 & 0xffff ^ uVar2)) >> 8;
  m68ki_cpu.x_flag = uVar2 >> 8;
  m68ki_cpu.not_z_flag = uVar2 & 0xffff;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *puVar3 = *puVar3 & 0xffff0000 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_add_16_er_i(void)
{
	uint* r_dst = &DX;
	uint src = OPER_I_16();
	uint dst = MASK_OUT_ABOVE_16(*r_dst);
	uint res = src + dst;

	FLAG_N = NFLAG_16(res);
	FLAG_V = VFLAG_ADD_16(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);

	*r_dst = MASK_OUT_BELOW_16(*r_dst) | FLAG_Z;
}